

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckResultTypes
          (ScriptValidator *this,Location *loc,TypeVector *actual,TypeVector *expected,char *desc)

{
  Type actual_00;
  Type expected_00;
  size_type sVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong local_38;
  size_t i;
  char *desc_local;
  TypeVector *expected_local;
  TypeVector *actual_local;
  Location *loc_local;
  ScriptValidator *this_local;
  
  sVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(actual);
  sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(expected);
  if (sVar1 == sVar2) {
    for (local_38 = 0; sVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(actual),
        local_38 < sVar1; local_38 = local_38 + 1) {
      pvVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[](actual,local_38);
      actual_00.enum_ = pvVar3->enum_;
      actual_00.type_index_ = pvVar3->type_index_;
      pvVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[](expected,local_38);
      expected_00.enum_ = pvVar3->enum_;
      expected_00.type_index_ = pvVar3->type_index_;
      CheckTypeIndex(this,loc,actual_00,expected_00,desc,(Index)local_38,"result");
    }
  }
  else {
    sVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(expected);
    sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(actual);
    PrintError(this,loc,"expected %zd results, got %zd",sVar1,sVar2);
  }
  return;
}

Assistant:

void ScriptValidator::CheckResultTypes(const Location* loc,
                                       const TypeVector& actual,
                                       const TypeVector& expected,
                                       const char* desc) {
  if (actual.size() == expected.size()) {
    for (size_t i = 0; i < actual.size(); ++i) {
      CheckTypeIndex(loc, actual[i], expected[i], desc, i, "result");
    }
  } else {
    PrintError(loc, "expected %" PRIzd " results, got %" PRIzd, expected.size(),
               actual.size());
  }
}